

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O1

void __thiscall HuffmanArchiver::count_data(HuffmanArchiver *this,istream *in)

{
  long *plVar1;
  mapped_type *pmVar2;
  char c;
  key_type local_21;
  
  plVar1 = (long *)std::istream::read((char *)in,(long)&local_21);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    do {
      pmVar2 = std::__detail::
               _Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_data,&local_21);
      *pmVar2 = *pmVar2 + 1;
      this->num_of_symbols_in = this->num_of_symbols_in + 1;
      plVar1 = (long *)std::istream::read((char *)in,(long)&local_21);
    } while ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0);
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  std::istream::seekg((long)in,_S_beg);
  return;
}

Assistant:

void HuffmanArchiver::count_data(std::istream &in) {
    char c;
    while (in.read(&c, 1)) {
        _data[c]++;
        num_of_symbols_in++;
    }
    in.clear();
    in.seekg(0, in.beg);
}